

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O1

shared_ptr<const_CBlock> __thiscall
validation_block_tests::MinerTestingSetup::GoodBlock(MinerTestingSetup *this,uint256 *prev_hash)

{
  TestingSetup *pTVar1;
  TokenPipeEnd TVar2;
  undefined4 uVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_FS_OFFSET;
  shared_ptr<CBlock> sVar5;
  shared_ptr<const_CBlock> sVar6;
  undefined1 auStack_48 [16];
  undefined8 local_38;
  _Head_base<0UL,_ECC_Context_*,_false> _Stack_30;
  _Head_base<0UL,_ECC_Context_*,_false> local_20;
  
  local_20._M_head_impl = *(ECC_Context **)(in_FS_OFFSET + 0x28);
  Block((MinerTestingSetup *)auStack_48,prev_hash);
  sVar5.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48;
  sVar5.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)prev_hash;
  sVar5 = FinalizeBlock((MinerTestingSetup *)&local_38,sVar5);
  _Var4 = sVar5.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  *(undefined8 *)
   &(this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup
    .m_interrupt.m_pipe_w = 0;
  TVar2.m_fd = _Stack_30._M_head_impl._0_4_;
  uVar3 = _Stack_30._M_head_impl._4_4_;
  _Stack_30._M_head_impl = (ECC_Context *)0x0;
  pTVar1 = &(this->super_RegTestingSetup).super_TestingSetup;
  (pTVar1->super_ChainTestingSetup).super_BasicTestingSetup.m_interrupt.m_flag =
       (atomic<bool>)local_38._0_1_;
  *(undefined3 *)&(pTVar1->super_ChainTestingSetup).super_BasicTestingSetup.m_interrupt.field_0x1 =
       local_38._1_3_;
  (this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
  m_interrupt.m_pipe_r.m_fd = local_38._4_4_;
  (this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
  m_interrupt.m_pipe_w.m_fd = TVar2.m_fd;
  *(undefined4 *)
   &(this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup
    .field_0xc = uVar3;
  local_38 = (Context *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48._8_8_);
    _Var4._M_pi = extraout_RDX;
  }
  if ((ECC_Context *)
      ((_Tuple_impl<0UL,_ECC_Context_*,_std::default_delete<ECC_Context>_> *)(in_FS_OFFSET + 0x28))
      ->super__Head_base<0UL,_ECC_Context_*,_false> == local_20._M_head_impl) {
    sVar6.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var4._M_pi;
    sVar6.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
    ;
    return (shared_ptr<const_CBlock>)
           sVar6.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<const CBlock> MinerTestingSetup::GoodBlock(const uint256& prev_hash)
{
    return FinalizeBlock(Block(prev_hash));
}